

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

atomic<google::protobuf::internal::SerialArena_*> * __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::arena
          (SerialArenaChunk *this,uint32_t i)

{
  uint32_t uVar1;
  string *psVar2;
  CopyConst<const_char,_ElementType<2UL>_>_conflict *pCVar3;
  uint32_t local_34;
  uint32_t local_30 [2];
  ulong local_28;
  ulong local_20;
  
  local_30[0] = i;
  local_34 = capacity(this);
  psVar2 = absl::lts_20240722::log_internal::Check_LTImpl<unsigned_int,unsigned_int>
                     (local_30,&local_34,"i < capacity()");
  if (psVar2 == (string *)0x0) {
    uVar1 = capacity(this);
    local_28 = (ulong)uVar1;
    local_30[0] = 1;
    local_30[1] = 0;
    local_20 = local_28;
    pCVar3 = absl::lts_20240722::container_internal::internal_layout::
             LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
             ::Pointer<2ul,char_const>
                       ((LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                         *)local_30,(char *)this);
    return pCVar3 + i;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/arena.cc"
             ,0x1d8,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_30);
}

Assistant:

const std::atomic<SerialArena*>& arena(uint32_t i) const {
    ABSL_DCHECK_LT(i, capacity());
    return Layout().Pointer<kArenas>(ptr())[i];
  }